

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt__get_svg(stbtt_fontinfo *info)

{
  stbtt_uint32 sVar1;
  stbtt_uint32 sVar2;
  char *in_RDI;
  stbtt_uint32 unaff_retaddr;
  stbtt_uint32 offset;
  stbtt_uint32 t;
  
  if (*(int *)(in_RDI + 0x34) < 0) {
    sVar1 = stbtt__find_table(_offset,unaff_retaddr,in_RDI);
    if (sVar1 == 0) {
      in_RDI[0x34] = '\0';
      in_RDI[0x35] = '\0';
      in_RDI[0x36] = '\0';
      in_RDI[0x37] = '\0';
    }
    else {
      sVar2 = ttULONG((stbtt_uint8 *)(*(long *)(in_RDI + 8) + (ulong)sVar1 + 2));
      *(stbtt_uint32 *)(in_RDI + 0x34) = sVar1 + sVar2;
    }
  }
  return *(int *)(in_RDI + 0x34);
}

Assistant:

static int stbtt__get_svg(stbtt_fontinfo *info)
{
stbtt_uint32 t;
if (info->svg < 0) {
t = stbtt__find_table(info->data, info->fontstart, "SVG ");
if (t) {
stbtt_uint32 offset = ttULONG(info->data + t + 2);
info->svg = t + offset;
} else {
info->svg = 0;
}
}
return info->svg;
}